

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessTexturesTests.cpp
# Opt level: O3

bool __thiscall
gl4cts::DirectStateAccess::Textures::StorageMultisampleTest::Test<unsigned_char,2,false,2u>
          (StorageMultisampleTest *this)

{
  bool bVar1;
  int iVar2;
  deUint32 dVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  long lVar5;
  
  iVar2 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar5 = CONCAT44(extraout_var,iVar2);
  (**(code **)(lVar5 + 0xff0))(0xcf5,1);
  dVar3 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar3,"glPixelStorei has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                  ,0xd69);
  (**(code **)(lVar5 + 0xff0))(0xd05,1);
  dVar3 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar3,"glPixelStorei has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                  ,0xd6c);
  CreateInputTexture<unsigned_char,2,false,2u>(this);
  bVar1 = PrepareFramebufferMultisample<2u>(this,0x8238);
  if (bVar1) {
    PrepareFramebufferAuxiliary<2u>(this,0x8238);
    Draw<2u>(this);
    bVar1 = Check<unsigned_char,2,false,2u>(this);
    iVar2 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
    if (this->m_to_aux != 0) {
      (**(code **)(CONCAT44(extraout_var_00,iVar2) + 0x480))(1,&this->m_to_aux);
      this->m_to_aux = 0;
    }
    CleanFramebuffers(this);
    iVar2 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
    if (this->m_to != 0) {
      (**(code **)(CONCAT44(extraout_var_01,iVar2) + 0x480))(1,&this->m_to);
      this->m_to = 0;
    }
    iVar2 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
    do {
      iVar4 = (**(code **)(CONCAT44(extraout_var_02,iVar2) + 0x800))();
    } while (iVar4 != 0);
  }
  else {
    iVar2 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
    if (this->m_to != 0) {
      (**(code **)(CONCAT44(extraout_var_03,iVar2) + 0x480))(1,&this->m_to);
      this->m_to = 0;
    }
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool StorageMultisampleTest::Test()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Setup. */
	gl.pixelStorei(GL_UNPACK_ALIGNMENT, sizeof(T));
	GLU_EXPECT_NO_ERROR(gl.getError(), "glPixelStorei has failed");

	gl.pixelStorei(GL_PACK_ALIGNMENT, sizeof(T));
	GLU_EXPECT_NO_ERROR(gl.getError(), "glPixelStorei has failed");

	CreateInputTexture<T, S, N, D>();

	if (!PrepareFramebufferMultisample<D>(InternalFormat<T, S, N>()))
	{
		CleanInputTexture();

		return false;
	}

	PrepareFramebufferAuxiliary<D>(InternalFormat<T, S, N>());

	/* Action. */
	Draw<D>();

	/* Compare results with reference. */
	bool result = Check<T, S, N, D>();

	/* Cleanup. */
	CleanAuxiliaryTexture();
	CleanFramebuffers();
	CleanInputTexture();
	CleanErrors();

	/* Pass result. */
	return result;
}